

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall
Gluco::vec<Gluco::vec<unsigned_int>_>::clear(vec<Gluco::vec<unsigned_int>_> *this,bool dealloc)

{
  long lVar1;
  int i;
  long lVar2;
  
  if (this->data != (vec<unsigned_int> *)0x0) {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < this->sz; lVar2 = lVar2 + 1) {
      vec<unsigned_int>::~vec((vec<unsigned_int> *)((long)&this->data->data + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    this->sz = 0;
    if (dealloc) {
      free(this->data);
      this->data = (vec<unsigned_int> *)0x0;
      this->cap = 0;
    }
  }
  return;
}

Assistant:

void vec<T>::clear(bool dealloc) {
    if (data != NULL){
        for (int i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) free(data), data = NULL, cap = 0; } }